

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePermuteLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  int iVar3;
  string *__rhs;
  Result local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string err;
  PermuteLayerParams *params;
  string local_128;
  Result local_108;
  allocator local_d9;
  string local_d8;
  Result local_b8;
  Result local_88;
  Result local_50;
  undefined1 local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *r;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result(__return_storage_ptr__);
  validateInputCount(&local_50,local_20,1,1);
  Result::operator=(__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount(&local_88,local_20,1,1);
    Result::operator=(__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
  }
  bVar2 = Result::good(__return_storage_ptr__);
  pNVar1 = local_20;
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"Permute",&local_d9);
    validateInputOutputRankEquality(&local_b8,pNVar1,&local_d8,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,&local_b8);
    Result::~Result(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    bVar2 = Result::good(__return_storage_ptr__);
    pNVar1 = local_20;
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"Permute",(allocator *)((long)&params + 7));
    validateRankCount(&local_108,pNVar1,&local_128,5,5,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,&local_108);
    Result::~Result(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
  }
  err.field_2._8_8_ = Specification::NeuralNetworkLayer::permute(local_20);
  iVar3 = Specification::PermuteLayerParams::axis_size((PermuteLayerParams *)err.field_2._8_8_);
  if (iVar3 != 4) {
    __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+(&local_178,"Permute layer \'",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   &local_178,"\' must have 4D axis parameters.");
    std::__cxx11::string::~string((string *)&local_178);
    Result::Result(&local_1a0,INVALID_MODEL_PARAMETERS,(string *)local_158);
    Result::operator=(__return_storage_ptr__,&local_1a0);
    Result::~Result(&local_1a0);
    std::__cxx11::string::~string((string *)local_158);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePermuteLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Permute", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Permute", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.permute();
    if (params.axis_size() != 4) {
        std::string err = "Permute layer '" + layer.name() + "' must have 4D axis parameters.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return r;
}